

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrobjs.c
# Opt level: O1

FT_Error pfr_face_get_kerning(FT_Face pfrface,FT_UInt glyph1,FT_UInt glyph2,FT_Vector *kerning)

{
  byte bVar1;
  byte bVar2;
  FT_Stream stream;
  long lVar3;
  FT_Error FVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  byte *pbVar11;
  byte *pbVar12;
  uint uVar13;
  byte *pbVar14;
  long *plVar15;
  
  uVar7 = glyph1 - 1;
  if (glyph1 == 0) {
    uVar7 = 0;
  }
  uVar6 = glyph2 - 1;
  if (glyph2 == 0) {
    uVar6 = 0;
  }
  kerning->x = 0;
  kerning->y = 0;
  uVar8 = *(uint *)&pfrface[2].generic.data;
  if ((uVar8 < uVar6 || uVar8 < uVar7) ||
     (plVar15 = (long *)pfrface[2].bbox.xMax, plVar15 == (long *)0x0)) {
    return 0;
  }
  stream = pfrface->stream;
  lVar3 = pfrface[2].bbox.xMin;
  uVar7 = *(int *)(lVar3 + (ulong)uVar7 * 0x10) << 0x10 |
          (uint)*(ushort *)(lVar3 + (ulong)uVar6 * 0x10);
  while ((uVar7 < *(uint *)(plVar15 + 3) || (*(uint *)((long)plVar15 + 0x1c) < uVar7))) {
    plVar15 = (long *)*plVar15;
    if (plVar15 == (long *)0x0) {
      return 0;
    }
  }
  FVar4 = FT_Stream_Seek(stream,plVar15[2]);
  if (FVar4 != 0) {
    return FVar4;
  }
  FVar4 = FT_Stream_EnterFrame
                    (stream,(ulong)((uint)*(byte *)(plVar15 + 1) * *(int *)((long)plVar15 + 0xc)));
  if (FVar4 != 0) {
    return FVar4;
  }
  bVar1 = *(byte *)(plVar15 + 1);
  uVar6 = *(uint *)((long)plVar15 + 0xc);
  iVar9 = 0x1f;
  if (bVar1 != 0) {
    for (; bVar1 >> iVar9 == 0; iVar9 = iVar9 + -1) {
    }
  }
  uVar8 = uVar6 << ((byte)iVar9 & 0x1f);
  uVar5 = (ulong)uVar8;
  pbVar12 = stream->cursor;
  bVar2 = *(byte *)((long)plVar15 + 9);
  iVar9 = (-1 << ((byte)iVar9 & 0x1f)) + (uint)bVar1;
  if (iVar9 == 0) {
joined_r0x00206d2a:
    while (uVar6 < uVar8) {
      uVar5 = uVar5 >> 1;
      pbVar14 = pbVar12 + uVar5;
      if ((bVar2 & 1) == 0) {
        pbVar11 = pbVar14 + 2;
        uVar8 = (uint)pbVar12[uVar5] << 0x10 | (uint)pbVar12[uVar5 + 1];
      }
      else {
        pbVar11 = pbVar14 + 4;
        uVar8 = (uint)pbVar14[3] |
                (uint)pbVar14[2] << 8 |
                (uint)pbVar12[uVar5 + 1] << 0x10 | (uint)pbVar12[uVar5] << 0x18;
      }
      if (uVar8 == uVar7) goto LAB_00206dc4;
      if (uVar7 <= uVar8) {
        pbVar14 = pbVar12;
      }
      pbVar12 = pbVar14;
      uVar8 = (uint)uVar5;
    }
    if ((bVar2 & 1) == 0) {
      pbVar11 = pbVar12 + 2;
      uVar6 = (uint)*pbVar12 << 0x10 | (uint)pbVar12[1];
    }
    else {
      pbVar11 = pbVar12 + 4;
      uVar6 = (uint)pbVar12[3] |
              (uint)pbVar12[2] << 8 | (uint)pbVar12[1] << 0x10 | (uint)*pbVar12 << 0x18;
    }
    if (uVar6 != uVar7) goto LAB_00206ded;
  }
  else {
    uVar10 = (ulong)(iVar9 * uVar6);
    if ((bVar2 & 1) == 0) {
      lVar3 = uVar10 + 2;
      uVar13 = (uint)pbVar12[uVar10] << 0x10 | (uint)pbVar12[uVar10 + 1];
    }
    else {
      lVar3 = uVar10 + 4;
      uVar13 = (uint)pbVar12[uVar10 + 3] |
               (uint)pbVar12[uVar10 + 2] << 8 |
               (uint)pbVar12[uVar10 + 1] << 0x10 | (uint)pbVar12[uVar10] << 0x18;
    }
    pbVar11 = pbVar12 + lVar3;
    if (uVar13 != uVar7) {
      if (uVar13 < uVar7) {
        pbVar12 = pbVar11 + (2 - (ulong)((bVar2 & 2) == 0));
      }
      goto joined_r0x00206d2a;
    }
  }
LAB_00206dc4:
  uVar5 = (ulong)*pbVar11;
  if ((bVar2 & 2) != 0) {
    uVar5 = (long)(short)((ushort)*pbVar11 << 8) | (ulong)pbVar11[1];
  }
  kerning->x = (long)*(short *)((long)plVar15 + 10) + uVar5;
LAB_00206ded:
  FT_Stream_ExitFrame(stream);
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pfr_face_get_kerning( FT_Face     pfrface,        /* PFR_Face */
                        FT_UInt     glyph1,
                        FT_UInt     glyph2,
                        FT_Vector*  kerning )
  {
    PFR_Face     face     = (PFR_Face)pfrface;
    FT_Error     error    = FT_Err_Ok;
    PFR_PhyFont  phy_font = &face->phy_font;
    FT_UInt32    code1, code2, pair;


    kerning->x = 0;
    kerning->y = 0;

    if ( glyph1 > 0 )
      glyph1--;

    if ( glyph2 > 0 )
      glyph2--;

    /* convert glyph indices to character codes */
    if ( glyph1 > phy_font->num_chars ||
         glyph2 > phy_font->num_chars )
      goto Exit;

    code1 = phy_font->chars[glyph1].char_code;
    code2 = phy_font->chars[glyph2].char_code;
    pair  = PFR_KERN_INDEX( code1, code2 );

    /* now search the list of kerning items */
    {
      PFR_KernItem  item   = phy_font->kern_items;
      FT_Stream     stream = pfrface->stream;


      for ( ; item; item = item->next )
      {
        if ( pair >= item->pair1 && pair <= item->pair2 )
          goto FoundPair;
      }
      goto Exit;

    FoundPair: /* we found an item, now parse it and find the value if any */
      if ( FT_STREAM_SEEK( item->offset )                       ||
           FT_FRAME_ENTER( item->pair_count * item->pair_size ) )
        goto Exit;

      {
        FT_UInt    count       = item->pair_count;
        FT_UInt    size        = item->pair_size;
        FT_UInt    power       = 1 << FT_MSB( count );
        FT_UInt    probe       = power * size;
        FT_UInt    extra       = count - power;
        FT_Byte*   base        = stream->cursor;
        FT_Bool    twobytes    = FT_BOOL( item->flags & PFR_KERN_2BYTE_CHAR );
        FT_Bool    twobyte_adj = FT_BOOL( item->flags & PFR_KERN_2BYTE_ADJ  );
        FT_Byte*   p;
        FT_UInt32  cpair;


        if ( extra > 0 )
        {
          p = base + extra * size;

          if ( twobytes )
            cpair = FT_NEXT_ULONG( p );
          else
            cpair = PFR_NEXT_KPAIR( p );

          if ( cpair == pair )
            goto Found;

          if ( cpair < pair )
          {
            if ( twobyte_adj )
              p += 2;
            else
              p++;
            base = p;
          }
        }

        while ( probe > size )
        {
          probe >>= 1;
          p       = base + probe;

          if ( twobytes )
            cpair = FT_NEXT_ULONG( p );
          else
            cpair = PFR_NEXT_KPAIR( p );

          if ( cpair == pair )
            goto Found;

          if ( cpair < pair )
            base += probe;
        }

        p = base;

        if ( twobytes )
          cpair = FT_NEXT_ULONG( p );
        else
          cpair = PFR_NEXT_KPAIR( p );

        if ( cpair == pair )
        {
          FT_Int  value;


        Found:
          if ( twobyte_adj )
            value = FT_PEEK_SHORT( p );
          else
            value = p[0];

          kerning->x = item->base_adj + value;
        }
      }

      FT_FRAME_EXIT();
    }

  Exit:
    return error;
  }